

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalSubtractOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  long params;
  long params_1;
  bool bVar2;
  OutOfRangeException *this;
  long lVar3;
  string local_48;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  params = *(long *)left->data;
  params_1 = *(long *)right->data;
  if (params_1 < 0) {
    lVar3 = params_1 + 999999999999999999;
    if (params <= lVar3) goto LAB_0098d474;
  }
  else {
    lVar3 = params_1 + -999999999999999999;
    if (lVar3 <= params) {
LAB_0098d474:
      lVar3 = params - params_1;
      bVar2 = true;
      goto LAB_0098d47c;
    }
  }
  bVar2 = false;
LAB_0098d47c:
  if (bVar2) {
    *(long *)result->data = lVar3;
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an explicit cast to a bigger decimal."
             ,"");
  OutOfRangeException::OutOfRangeException<long,long>(this,&local_48,params,params_1);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}